

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void MoveToHead(TidyDocImpl *doc,Node *element,Node *node)

{
  Node *pNVar1;
  Bool BVar2;
  Node *pNVar3;
  Node **ppNVar4;
  
  prvTidyRemoveNode(node);
  BVar2 = prvTidynodeIsElement(node);
  if (BVar2 == no) {
    prvTidyReport(doc,element,node,0x235);
    prvTidyFreeNode(doc,node);
    return;
  }
  prvTidyReport(doc,element,node,0x27e);
  pNVar3 = prvTidyFindHEAD(doc);
  if (pNVar3 != (Node *)0x0) {
    node->parent = pNVar3;
    pNVar1 = pNVar3->last;
    node->prev = pNVar1;
    ppNVar4 = &pNVar1->next;
    if (pNVar1 == (Node *)0x0) {
      ppNVar4 = &pNVar3->content;
    }
    *ppNVar4 = node;
    pNVar3->last = node;
    if (node->tag->parser != (Parser *)0x0) {
      ParseTag(doc,node,IgnoreWhitespace);
      return;
    }
    return;
  }
  __assert_fail("head != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/parser.c"
                ,0x2ef,"void MoveToHead(TidyDocImpl *, Node *, Node *)");
}

Assistant:

static void MoveToHead( TidyDocImpl* doc, Node *element, Node *node )
{
    Node *head;

    TY_(RemoveNode)( node );  /* make sure that node is isolated */

    if ( TY_(nodeIsElement)(node) )
    {
        TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN );

        head = TY_(FindHEAD)(doc);
        assert(head != NULL);

        TY_(InsertNodeAtEnd)(head, node);

        if ( node->tag->parser )
            ParseTag( doc, node, IgnoreWhitespace );
    }
    else
    {
        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node );
    }
}